

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O1

bufsize_t __thiscall
LdConfigEntryWrapper::getFieldSize(LdConfigEntryWrapper *this,size_t fieldId,size_t subField)

{
  int iVar1;
  undefined4 extraout_var;
  bufsize_t bVar2;
  
  iVar1 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xf])();
  bVar2 = 0;
  if (fieldId < CONCAT44(extraout_var,iVar1)) {
    bVar2 = (ulong)(fieldId == 0) * 3 + 1;
  }
  return bVar2;
}

Assistant:

bufsize_t LdConfigEntryWrapper::getFieldSize(size_t fieldId, size_t subField)
{
    size_t count = this->getFieldsCount();
    if (fieldId >= count) {
        return 0;
    }
    if (fieldId == HANDLER_ADDR) {
        return sizeof(DWORD);
    }
    return sizeof(BYTE);
}